

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O2

size_t __thiscall ans_byte_encode::serialize(ans_byte_encode *this,uint8_t **out_u8)

{
  ushort uVar1;
  uint32_t *f;
  size_t sVar2;
  uint uVar3;
  size_t sym;
  long lVar4;
  array<unsigned_int,_256UL> increasing_freqs;
  
  f = (uint32_t *)*out_u8;
  uVar1 = (this->nfreqs)._M_elems[0];
  uVar3 = (uint)uVar1;
  increasing_freqs._M_elems[0] = (uint)uVar1;
  for (lVar4 = 1; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    uVar3 = uVar3 + 1 + (uint)(this->nfreqs)._M_elems[lVar4];
    increasing_freqs._M_elems[lVar4] = uVar3;
  }
  sVar2 = interpolative_internal::encode(f,increasing_freqs._M_elems,0x100,0x1100);
  *out_u8 = *out_u8 + sVar2;
  return sVar2;
}

Assistant:

size_t serialize(uint8_t*& out_u8)
    {
        auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
        std::array<uint32_t, constants::MAX_SIGMA> increasing_freqs;
        increasing_freqs[0] = nfreqs[0];
        for (size_t sym = 1; sym < constants::MAX_SIGMA; sym++) {
            increasing_freqs[sym] = increasing_freqs[sym - 1] + nfreqs[sym] + 1;
        }
        auto in_buf = increasing_freqs.data();
        auto bytes_written = interpolative_internal::encode(out_ptr_u32, in_buf,
            constants::MAX_SIGMA,
            constants::MAX_FRAME_SIZE + constants::MAX_SIGMA);

        out_u8 += bytes_written;
        return bytes_written;
    }